

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentTypeImpl.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::DOMDocumentTypeImpl::DOMDocumentTypeImpl
          (DOMDocumentTypeImpl *this,DOMDocument *ownerDoc,XMLCh *qualifiedName,XMLCh *pubId,
          XMLCh *sysId,bool heap)

{
  DOMNode *pDVar1;
  code *pcVar2;
  short *psVar3;
  short *psVar4;
  bool bVar5;
  int iVar6;
  XMLMutexLock *target;
  DOMException *pDVar7;
  undefined4 extraout_var;
  long **pplVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar9;
  XMLCh *pXVar10;
  _func_int *p_Var11;
  undefined4 extraout_var_03;
  DOMNamedNodeMapImpl *pDVar12;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long lVar13;
  undefined8 *puVar14;
  long *plVar15;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  DOMNode *pDVar16;
  uint uVar17;
  XMLSize_t maxChars;
  _func_int **pp_Var18;
  long *plVar19;
  _func_int **pp_Var20;
  long lVar21;
  long lVar22;
  XMLCh XVar23;
  undefined8 *puVar24;
  _func_int *p_Var25;
  XMLCh temp [256];
  XMLMutexLock local_238 [65];
  undefined4 extraout_var_02;
  
  (this->super_DOMDocumentType).super_DOMNode._vptr_DOMNode =
       (_func_int **)&PTR__DOMDocumentTypeImpl_00404248;
  (this->super_HasDOMNodeImpl)._vptr_HasDOMNodeImpl =
       (_func_int **)&PTR__DOMDocumentTypeImpl_00404428;
  (this->super_HasDOMParentImpl)._vptr_HasDOMParentImpl =
       (_func_int **)&PTR__DOMDocumentTypeImpl_00404458;
  (this->super_HasDOMChildImpl)._vptr_HasDOMChildImpl =
       (_func_int **)&PTR__DOMDocumentTypeImpl_00404488;
  pDVar1 = &ownerDoc->super_DOMNode;
  pDVar16 = pDVar1;
  if (ownerDoc == (DOMDocument *)0x0) {
    pDVar16 = (DOMNode *)0x0;
  }
  DOMNodeImpl::DOMNodeImpl(&this->fNode,(DOMNode *)this,pDVar16);
  DOMParentNode::DOMParentNode(&this->fParent,(DOMNode *)this,ownerDoc);
  DOMChildNode::DOMChildNode(&this->fChild);
  *(undefined8 *)((long)&this->fSystemId + 1) = 0;
  *(undefined8 *)((long)&this->fInternalSubset + 1) = 0;
  this->fPublicId = (XMLCh *)0x0;
  this->fSystemId = (XMLCh *)0x0;
  this->fNotations = (DOMNamedNodeMapImpl *)0x0;
  this->fElements = (DOMNamedNodeMapImpl *)0x0;
  this->fName = (XMLCh *)0x0;
  this->fEntities = (DOMNamedNodeMapImpl *)0x0;
  this->fIsCreatedFromHeap = heap;
  uVar9 = 0;
  maxChars = 0xffffffff;
  iVar6 = 0;
  do {
    if (qualifiedName[uVar9] == L':') {
      iVar6 = iVar6 + 1;
      maxChars = uVar9 & 0xffffffff;
    }
    else if (qualifiedName[uVar9] == L'\0') break;
    uVar9 = uVar9 + 1;
  } while( true );
  if (((((int)uVar9 != 0) && (uVar17 = (uint)maxChars, uVar17 != 0)) && ((int)uVar9 - 1U != uVar17))
     && (iVar6 < 2)) {
    if (uVar17 != 0xffffffff) {
      if ((int)uVar17 < 0) goto LAB_0026873a;
      if (uVar17 < 0xff) {
        target = local_238;
      }
      else {
        if (qualifiedName == (XMLCh *)0x0) {
          lVar22 = 2;
        }
        else {
          lVar21 = 0;
          do {
            lVar22 = lVar21 + 2;
            psVar3 = (short *)((long)qualifiedName + lVar21);
            lVar21 = lVar22;
          } while (*psVar3 != 0);
        }
        target = (XMLMutexLock *)
                 (**(code **)(*XMLPlatformUtils::fgMemoryManager + 0x18))
                           (XMLPlatformUtils::fgMemoryManager,lVar22);
      }
      XMLString::copyNString((XMLCh *)target,qualifiedName,maxChars);
      *(undefined2 *)((long)&target->fToLock + maxChars * 2) = 0;
      if (ownerDoc == (DOMDocument *)0x0) {
        bVar5 = XMLChar1_0::isValidName((XMLCh *)target);
        if ((!bVar5) || (bVar5 = XMLChar1_0::isValidName(qualifiedName + maxChars + 1), !bVar5)) {
          pDVar7 = (DOMException *)__cxa_allocate_exception(0x28);
          iVar6 = (*(this->super_DOMDocumentType).super_DOMNode._vptr_DOMNode[0xc])(this);
          if (CONCAT44(extraout_var_08,iVar6) == 0) {
            pplVar8 = &XMLPlatformUtils::fgMemoryManager;
          }
          else {
            iVar6 = (*(this->super_DOMDocumentType).super_DOMNode._vptr_DOMNode[0xc])(this);
            pplVar8 = (long **)(CONCAT44(extraout_var_10,iVar6) + 0x158);
          }
          DOMException::DOMException(pDVar7,0xe,0,(MemoryManager *)*pplVar8);
          goto LAB_00268802;
        }
      }
      else {
        bVar5 = DOMDocumentImpl::isXMLName
                          ((DOMDocumentImpl *)&ownerDoc[-1].super_DOMNode,(XMLCh *)target);
        if ((!bVar5) ||
           (bVar5 = DOMDocumentImpl::isXMLName
                              ((DOMDocumentImpl *)&ownerDoc[-1].super_DOMNode,
                               qualifiedName + maxChars + 1), !bVar5)) {
          pDVar7 = (DOMException *)__cxa_allocate_exception(0x28);
          iVar6 = (*(this->super_DOMDocumentType).super_DOMNode._vptr_DOMNode[0xc])(this);
          if (CONCAT44(extraout_var,iVar6) == 0) {
            pplVar8 = &XMLPlatformUtils::fgMemoryManager;
          }
          else {
            iVar6 = (*(this->super_DOMDocumentType).super_DOMNode._vptr_DOMNode[0xc])(this);
            pplVar8 = (long **)(CONCAT44(extraout_var_09,iVar6) + 0x158);
          }
          DOMException::DOMException(pDVar7,0xe,0,(MemoryManager *)*pplVar8);
LAB_00268802:
          __cxa_throw(pDVar7,&DOMException::typeinfo,DOMException::~DOMException);
        }
      }
      if (0xfe < uVar17) {
        (**(code **)(*XMLPlatformUtils::fgMemoryManager + 0x20))
                  (XMLPlatformUtils::fgMemoryManager,target);
      }
    }
    if (ownerDoc == (DOMDocument *)0x0) {
      XMLMutexLock::XMLMutexLock(local_238,sDocumentMutex);
      lVar22 = sDocument;
      plVar15 = (long *)(sDocument + -8);
      pXVar10 = (XMLCh *)(**(code **)(*(long *)(sDocument + -8) + 0x38))(plVar15,pubId);
      this->fPublicId = pXVar10;
      pXVar10 = (XMLCh *)(**(code **)(*plVar15 + 0x38))(plVar15,sysId);
      this->fSystemId = pXVar10;
      if (qualifiedName == (XMLCh *)0x0) {
        pXVar10 = (XMLCh *)0x0;
      }
      else {
        lVar21 = 0;
        do {
          psVar3 = (short *)((long)qualifiedName + lVar21);
          lVar21 = lVar21 + 2;
        } while (*psVar3 != 0);
        uVar9 = (ulong)(ushort)*qualifiedName;
        if (uVar9 == 0) {
          uVar9 = 0;
        }
        else {
          XVar23 = qualifiedName[1];
          if (XVar23 != L'\0') {
            pXVar10 = qualifiedName + 2;
            do {
              uVar9 = (ulong)(ushort)XVar23 + (uVar9 >> 0x18) + uVar9 * 0x26;
              XVar23 = *pXVar10;
              pXVar10 = pXVar10 + 1;
            } while (XVar23 != L'\0');
          }
          uVar9 = uVar9 % *(ulong *)(lVar22 + 0x138);
        }
        lVar21 = (lVar21 >> 1) + -1;
        puVar14 = *(undefined8 **)(*(long *)(lVar22 + 0x130) + uVar9 * 8);
        if (puVar14 == (undefined8 *)0x0) {
          puVar24 = (undefined8 *)(*(long *)(lVar22 + 0x130) + uVar9 * 8);
        }
        else {
          do {
            puVar24 = puVar14;
            if (puVar24[1] == lVar21) {
              pXVar10 = (XMLCh *)(puVar24 + 2);
              if (pXVar10 == qualifiedName) goto LAB_00268666;
              lVar13 = 0;
              do {
                psVar3 = (short *)((long)pXVar10 + lVar13);
                if (*psVar3 == 0) {
                  if (*(short *)((long)qualifiedName + lVar13) == 0) goto LAB_00268666;
                  break;
                }
                psVar4 = (short *)((long)qualifiedName + lVar13);
                lVar13 = lVar13 + 2;
              } while (*psVar3 == *psVar4);
            }
            puVar14 = (undefined8 *)*puVar24;
          } while ((undefined8 *)*puVar24 != (undefined8 *)0x0);
        }
        puVar14 = (undefined8 *)(**(code **)(*plVar15 + 0x20))(plVar15,lVar21 * 2 + 0x18);
        *puVar24 = puVar14;
        puVar14[1] = lVar21;
        *puVar14 = 0;
        pXVar10 = (XMLCh *)(puVar14 + 2);
        XMLString::copyString(pXVar10,qualifiedName);
      }
LAB_00268666:
      this->fName = pXVar10;
      plVar19 = (long *)(lVar22 + 0x18);
      plVar15 = (long *)(**(code **)(*(long *)(lVar22 + 0x18) + 0x130))
                                  (plVar19,&XMLUni::fgXercescInterfaceDOMMemoryManager,0);
      pDVar12 = (DOMNamedNodeMapImpl *)(**(code **)(*plVar15 + 0x20))(plVar15,0x618);
      DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar12,(DOMNode *)this);
      this->fEntities = pDVar12;
      plVar15 = (long *)(**(code **)(*plVar19 + 0x130))
                                  (plVar19,&XMLUni::fgXercescInterfaceDOMMemoryManager,0);
      pDVar12 = (DOMNamedNodeMapImpl *)(**(code **)(*plVar15 + 0x20))(plVar15,0x618);
      DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar12,(DOMNode *)this);
      this->fNotations = pDVar12;
      plVar15 = (long *)(**(code **)(*plVar19 + 0x130))
                                  (plVar19,&XMLUni::fgXercescInterfaceDOMMemoryManager,0);
      pDVar12 = (DOMNamedNodeMapImpl *)(**(code **)(*plVar15 + 0x20))(plVar15,0x618);
      DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar12,(DOMNode *)this);
      this->fElements = pDVar12;
      XMLMutexLock::~XMLMutexLock(local_238);
    }
    else {
      pDVar16 = &ownerDoc[-1].super_DOMNode;
      iVar6 = (*ownerDoc[-1].super_DOMNode._vptr_DOMNode[7])(pDVar16,pubId);
      this->fPublicId = (XMLCh *)CONCAT44(extraout_var_00,iVar6);
      iVar6 = (*pDVar16->_vptr_DOMNode[7])(pDVar16,sysId);
      this->fSystemId = (XMLCh *)CONCAT44(extraout_var_01,iVar6);
      if (qualifiedName == (XMLCh *)0x0) {
        pp_Var18 = (_func_int **)0x0;
      }
      else {
        lVar22 = 0;
        do {
          psVar3 = (short *)((long)qualifiedName + lVar22);
          lVar22 = lVar22 + 2;
        } while (*psVar3 != 0);
        uVar9 = (ulong)(ushort)*qualifiedName;
        if (uVar9 == 0) {
          uVar9 = 0;
        }
        else {
          XVar23 = qualifiedName[1];
          if (XVar23 != L'\0') {
            pXVar10 = qualifiedName + 2;
            do {
              uVar9 = (ulong)(ushort)XVar23 + (uVar9 >> 0x18) + uVar9 * 0x26;
              XVar23 = *pXVar10;
              pXVar10 = pXVar10 + 1;
            } while (XVar23 != L'\0');
          }
          uVar9 = uVar9 % (ulong)ownerDoc[9].super_DOMNode._vptr_DOMNode;
        }
        p_Var25 = (_func_int *)((lVar22 >> 1) + -1);
        pp_Var20 = ownerDoc[9].super_DOMDocumentTraversal._vptr_DOMDocumentTraversal;
        pp_Var18 = (_func_int **)pp_Var20[uVar9];
        if (pp_Var18 == (_func_int **)0x0) {
          pp_Var20 = pp_Var20 + uVar9;
        }
        else {
          do {
            pp_Var20 = pp_Var18;
            if (pp_Var20[1] == p_Var25) {
              pp_Var18 = pp_Var20 + 2;
              if (pp_Var18 == (_func_int **)qualifiedName) goto LAB_00268514;
              lVar22 = 0;
              do {
                pcVar2 = (code *)((long)pp_Var18 + lVar22);
                if (*(short *)pcVar2 == 0) {
                  if (*(short *)((long)qualifiedName + lVar22) == 0) goto LAB_00268514;
                  break;
                }
                psVar3 = (short *)((long)qualifiedName + lVar22);
                lVar22 = lVar22 + 2;
              } while (*(short *)pcVar2 == *psVar3);
            }
            pp_Var18 = (_func_int **)*pp_Var20;
          } while ((_func_int **)*pp_Var20 != (_func_int **)0x0);
        }
        iVar6 = (*pDVar16->_vptr_DOMNode[4])(pDVar16,(long)p_Var25 * 2 + 0x18);
        p_Var11 = (_func_int *)CONCAT44(extraout_var_02,iVar6);
        *pp_Var20 = p_Var11;
        *(_func_int **)(p_Var11 + 8) = p_Var25;
        *(undefined8 *)p_Var11 = 0;
        pp_Var18 = (_func_int **)(p_Var11 + 0x10);
        XMLString::copyString((XMLCh *)pp_Var18,qualifiedName);
      }
LAB_00268514:
      this->fName = (XMLCh *)pp_Var18;
      iVar6 = (*pDVar1->_vptr_DOMNode[0x26])(pDVar1,&XMLUni::fgXercescInterfaceDOMMemoryManager,0);
      pDVar12 = (DOMNamedNodeMapImpl *)
                (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar6) + 0x20))
                          ((long *)CONCAT44(extraout_var_03,iVar6),0x618);
      DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar12,(DOMNode *)this);
      this->fEntities = pDVar12;
      iVar6 = (*pDVar1->_vptr_DOMNode[0x26])(pDVar1,&XMLUni::fgXercescInterfaceDOMMemoryManager,0);
      pDVar12 = (DOMNamedNodeMapImpl *)
                (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar6) + 0x20))
                          ((long *)CONCAT44(extraout_var_04,iVar6),0x618);
      DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar12,(DOMNode *)this);
      this->fNotations = pDVar12;
      iVar6 = (*pDVar1->_vptr_DOMNode[0x26])(pDVar1,&XMLUni::fgXercescInterfaceDOMMemoryManager,0);
      pDVar12 = (DOMNamedNodeMapImpl *)
                (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar6) + 0x20))
                          ((long *)CONCAT44(extraout_var_05,iVar6),0x618);
      DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar12,(DOMNode *)this);
      this->fElements = pDVar12;
    }
    return;
  }
LAB_0026873a:
  pDVar7 = (DOMException *)__cxa_allocate_exception(0x28);
  iVar6 = (*(this->super_DOMDocumentType).super_DOMNode._vptr_DOMNode[0xc])(this);
  if (CONCAT44(extraout_var_06,iVar6) == 0) {
    pplVar8 = &XMLPlatformUtils::fgMemoryManager;
  }
  else {
    iVar6 = (*(this->super_DOMDocumentType).super_DOMNode._vptr_DOMNode[0xc])(this);
    pplVar8 = (long **)(CONCAT44(extraout_var_07,iVar6) + 0x158);
  }
  DOMException::DOMException(pDVar7,0xe,0,(MemoryManager *)*pplVar8);
  __cxa_throw(pDVar7,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

DOMDocumentTypeImpl::DOMDocumentTypeImpl(DOMDocument *ownerDoc,
                                   const XMLCh *qualifiedName,
                                   const XMLCh *pubId,
                                   const XMLCh *sysId,
                                   bool heap)
    : fNode(this, ownerDoc),
    fParent(this, ownerDoc),
    fName(0),
    fEntities(0),
    fNotations(0),
    fElements(0),
    fPublicId(0),
    fSystemId(0),
    fInternalSubset(0),
    fIntSubsetReading(false),
    fIsCreatedFromHeap(heap)
{
    int index = DOMDocumentImpl::indexofQualifiedName(qualifiedName);
    if (index < 0)
        throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);
    else if (index > 0)
    {
        // we have to make sure the qualifiedName has correct prefix and localName
        // although we don't really to store them separately
        XMLCh* newName;
        XMLCh temp[256];
        if (index >= 255)
            newName = (XMLCh*) XMLPlatformUtils::fgMemoryManager->allocate
            (
                (XMLString::stringLen(qualifiedName)+1) * sizeof(XMLCh)
            );//new XMLCh[XMLString::stringLen(qualifiedName)+1];
        else
            newName = temp;

        XMLString::copyNString(newName, qualifiedName, index);
        newName[index] = chNull;

        // Before we carry on, we should check if the prefix or localName are valid XMLName
        if (ownerDoc) {
            if (!((DOMDocumentImpl*)ownerDoc)->isXMLName(newName) || !((DOMDocumentImpl*)ownerDoc)->isXMLName(qualifiedName+index+1))
                throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);
        }
        else {
            // document is not there yet, so assume XML 1.0
            if (!XMLChar1_0::isValidName(newName) || !XMLChar1_0::isValidName(qualifiedName+index+1))
                throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);
        }

        if (index >= 255)
            XMLPlatformUtils::fgMemoryManager->deallocate(newName);//delete[] newName;
    }

    if (ownerDoc)
    {
        DOMDocumentImpl *docImpl = (DOMDocumentImpl *)ownerDoc;
        fPublicId = docImpl->cloneString(pubId);
        fSystemId = docImpl->cloneString(sysId);
        fName = ((DOMDocumentImpl *)ownerDoc)->getPooledString(qualifiedName);
        fEntities = new (ownerDoc) DOMNamedNodeMapImpl(this);
        fNotations= new (ownerDoc) DOMNamedNodeMapImpl(this);
        fElements = new (ownerDoc) DOMNamedNodeMapImpl(this);
    }
    else
    {
        XMLMutexLock lock(sDocumentMutex);
        DOMDocument* doc = sDocument;
        fPublicId = ((DOMDocumentImpl*) doc)->cloneString(pubId);
        fSystemId = ((DOMDocumentImpl*) doc)->cloneString(sysId);
        fName = ((DOMDocumentImpl*) doc)->getPooledString(qualifiedName);
        fEntities = new (doc) DOMNamedNodeMapImpl(this);
        fNotations= new (doc) DOMNamedNodeMapImpl(this);
        fElements = new (doc) DOMNamedNodeMapImpl(this);
    }
}